

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O2

void __thiscall
fmt::v11::detail::parse_format_string<char,fmt::v11::detail::format_handler<char>>
          (detail *this,basic_string_view<char> fmt,format_handler<char> *handler)

{
  format_args *this_00;
  detail dVar1;
  undefined1 value [16];
  undefined1 value_00 [16];
  basic_appender<char> out;
  basic_appender<char> out_00;
  int iVar2;
  basic_appender<char> out_01;
  format_handler<char> *this_01;
  detail *end;
  detail *end_00;
  detail *pdVar3;
  void *value_01;
  id_adapter *piVar4;
  longdouble in_stack_ffffffffffffff48;
  undefined6 in_stack_ffffffffffffff52;
  anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 local_a8;
  undefined4 local_98;
  id_adapter local_80;
  id_adapter local_70;
  undefined8 uStack_60;
  undefined4 local_58;
  format_handler<char> *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  this_01 = (format_handler<char> *)fmt.size_;
  end = (detail *)(fmt.data_ + (long)this);
  this_00 = &(this_01->ctx).args_;
  pdVar3 = this;
LAB_003e58ad:
  end_00 = pdVar3;
  if (end_00 == end) {
    format_handler<char>::on_text(this_01,(char *)this,(char *)end);
    return;
  }
  pdVar3 = end_00 + 1;
  if (*end_00 != (detail)0x7d) goto code_r0x003e58c2;
  if ((pdVar3 == end) || (*pdVar3 != (detail)0x7d)) {
    report_error("unmatched \'}\' in format string");
  }
  format_handler<char>::on_text(this_01,(char *)this,(char *)pdVar3);
  goto LAB_003e5962;
code_r0x003e58c2:
  if (*end_00 != (detail)0x7b) goto LAB_003e58ad;
  format_handler<char>::on_text(this_01,(char *)this,(char *)end_00);
  if (pdVar3 == end) {
    report_error("invalid format string");
  }
  dVar1 = *pdVar3;
  if (dVar1 == (detail)0x3a) {
    iVar2 = parse_context<char>::next_arg_id((parse_context<char> *)this_01);
LAB_003e5a15:
    pdVar3 = (detail *)
             format_handler<char>::on_format_specs(this_01,iVar2,(char *)(pdVar3 + 1),(char *)end);
    if ((pdVar3 == end) || (*pdVar3 != (detail)0x7d)) {
      report_error("unknown format specifier");
    }
    this = pdVar3 + 1;
    pdVar3 = this;
    goto LAB_003e58ad;
  }
  if (dVar1 == (detail)0x7b) {
    this = end_00 + 2;
    format_handler<char>::on_text(this_01,(char *)pdVar3,(char *)this);
    pdVar3 = this;
    goto LAB_003e58ad;
  }
  if (dVar1 == (detail)0x7d) {
    iVar2 = parse_context<char>::next_arg_id((parse_context<char> *)this_01);
    basic_format_args<fmt::v11::context>::get((format_arg *)&local_a8.string,this_00,iVar2);
    out_01.container = (this_01->ctx).out_.container;
    local_80.handler = (format_handler<char> *)out_01.container;
    switch(local_98) {
    case 1:
switchD_003e5930_caseD_1:
      write<char,_fmt::v11::basic_appender<char>,_int,_0>(out_01,local_a8.int_value);
      break;
    case 2:
switchD_003e5930_caseD_2:
      write<char,_fmt::v11::basic_appender<char>,_unsigned_int,_0>(out_01,local_a8.uint_value);
      break;
    case 3:
switchD_003e5930_caseD_3:
      write<char,_fmt::v11::basic_appender<char>,_long_long,_0>
                (out_01,CONCAT44(local_a8.long_long_value._4_4_,local_a8.int_value));
      break;
    case 4:
switchD_003e5930_caseD_4:
      write<char,_fmt::v11::basic_appender<char>,_unsigned_long_long,_0>
                (out_01,CONCAT44(local_a8.long_long_value._4_4_,local_a8.int_value));
      break;
    case 5:
switchD_003e5930_caseD_5:
      out.container._4_4_ = local_a8.long_long_value._4_4_;
      out.container._0_4_ = local_a8.int_value;
      value._10_6_ = in_stack_ffffffffffffff52;
      value._0_10_ = in_stack_ffffffffffffff48;
      write<char,_fmt::v11::basic_appender<char>,___int128,_0>
                ((detail *)out_01.container,out,(__int128)value);
      break;
    case 6:
switchD_003e5930_caseD_6:
      out_00.container._4_4_ = local_a8.long_long_value._4_4_;
      out_00.container._0_4_ = local_a8.int_value;
      value_00._10_6_ = in_stack_ffffffffffffff52;
      value_00._0_10_ = in_stack_ffffffffffffff48;
      write<char,_fmt::v11::basic_appender<char>,_unsigned___int128,_0>
                ((detail *)out_01.container,out_00,(unsigned___int128)value_00);
      break;
    case 7:
      piVar4 = &local_80;
LAB_003e5b84:
      default_arg_formatter<char>::operator()<bool,_0>
                ((default_arg_formatter<char> *)piVar4,local_a8.bool_value);
      break;
    case 8:
switchD_003e5930_caseD_8:
      write<char,fmt::v11::basic_appender<char>>(out_01,local_a8.char_value);
      break;
    case 9:
switchD_003e5930_caseD_9:
      write<char,_fmt::v11::basic_appender<char>,_float,_0>(out_01,local_a8.float_value);
      break;
    case 10:
switchD_003e5930_caseD_a:
      write<char,_fmt::v11::basic_appender<char>,_double,_0>
                (out_01,(double)CONCAT44(local_a8.long_long_value._4_4_,local_a8.int_value));
      break;
    case 0xb:
switchD_003e5930_caseD_b:
      in_stack_ffffffffffffff48 =
           (longdouble)
           CONCAT28(local_a8.int128_value._8_2_,
                    CONCAT44(local_a8.long_long_value._4_4_,local_a8.int_value));
      write<char,_fmt::v11::basic_appender<char>,_long_double,_0>(out_01,in_stack_ffffffffffffff48);
      break;
    case 0xc:
switchD_003e5930_caseD_c:
      write<char,fmt::v11::basic_appender<char>>
                (out_01,(char *)CONCAT44(local_a8.long_long_value._4_4_,local_a8.int_value));
      break;
    case 0xd:
switchD_003e5930_caseD_d:
      copy_noinline<char,char_const*,fmt::v11::basic_appender<char>>
                ((char *)CONCAT44(local_a8.long_long_value._4_4_,local_a8.int_value),
                 (char *)CONCAT44(local_a8.long_long_value._4_4_,local_a8.int_value) +
                 CONCAT62(local_a8.int128_value._10_6_,local_a8.int128_value._8_2_),out_01);
      break;
    case 0xe:
      value_01 = (void *)CONCAT44(local_a8.long_long_value._4_4_,local_a8.int_value);
      piVar4 = &local_80;
LAB_003e5b70:
      default_arg_formatter<char>::operator()<const_void_*,_0>
                ((default_arg_formatter<char> *)piVar4,value_01);
      break;
    case 0xf:
switchD_003e5930_caseD_f:
      local_70.arg_id = 0;
      local_70._12_4_ = 0;
      uStack_60 = 0;
      local_58 = 0;
      local_48 = 0;
      uStack_40 = 0;
      local_38 = 0;
      local_50 = (format_handler<char> *)out_01.container;
      (*(code *)CONCAT62(local_a8.int128_value._10_6_,local_a8.int128_value._8_2_))
                (CONCAT44(local_a8.long_long_value._4_4_,local_a8.int_value),&local_70.arg_id,
                 &local_50);
      break;
    default:
switchD_003e5930_default:
      report_error("argument not found");
    }
LAB_003e5962:
    this = pdVar3 + 1;
    pdVar3 = this;
    goto LAB_003e58ad;
  }
  local_80.arg_id = 0;
  local_80.handler = this_01;
  pdVar3 = (detail *)
           parse_arg_id<char,fmt::v11::detail::parse_replacement_field<char,fmt::v11::detail::format_handler<char>&>(char_const*,char_const*,fmt::v11::detail::format_handler<char>&)::id_adapter&>
                     ((char *)pdVar3,(char *)end,&local_80);
  if (pdVar3 == end) {
LAB_003e5bd2:
    report_error("missing \'}\' in format string");
  }
  iVar2 = local_80.arg_id;
  if (*pdVar3 == (detail)0x3a) goto LAB_003e5a15;
  if (*pdVar3 != (detail)0x7d) goto LAB_003e5bd2;
  basic_format_args<fmt::v11::context>::get((format_arg *)&local_a8.string,this_00,local_80.arg_id);
  out_01.container = (this_01->ctx).out_.container;
  local_70.handler = (format_handler<char> *)out_01.container;
  switch(local_98) {
  case 1:
    goto switchD_003e5930_caseD_1;
  case 2:
    goto switchD_003e5930_caseD_2;
  case 3:
    goto switchD_003e5930_caseD_3;
  case 4:
    goto switchD_003e5930_caseD_4;
  case 5:
    goto switchD_003e5930_caseD_5;
  case 6:
    goto switchD_003e5930_caseD_6;
  case 7:
    piVar4 = &local_70;
    goto LAB_003e5b84;
  case 8:
    goto switchD_003e5930_caseD_8;
  case 9:
    goto switchD_003e5930_caseD_9;
  case 10:
    goto switchD_003e5930_caseD_a;
  case 0xb:
    goto switchD_003e5930_caseD_b;
  case 0xc:
    goto switchD_003e5930_caseD_c;
  case 0xd:
    goto switchD_003e5930_caseD_d;
  case 0xe:
    value_01 = (void *)CONCAT44(local_a8.long_long_value._4_4_,local_a8.int_value);
    piVar4 = &local_70;
    goto LAB_003e5b70;
  case 0xf:
    goto switchD_003e5930_caseD_f;
  default:
    goto switchD_003e5930_default;
  }
}

Assistant:

FMT_CONSTEXPR void parse_format_string(basic_string_view<Char> fmt,
                                       Handler&& handler) {
  auto begin = fmt.data(), end = begin + fmt.size();
  auto p = begin;
  while (p != end) {
    auto c = *p++;
    if (c == '{') {
      handler.on_text(begin, p - 1);
      begin = p = parse_replacement_field(p - 1, end, handler);
    } else if (c == '}') {
      if (p == end || *p != '}')
        return handler.on_error("unmatched '}' in format string");
      handler.on_text(begin, p);
      begin = ++p;
    }
  }
  handler.on_text(begin, end);
}